

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_release(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *arg1;
  CHAR_DATA *in_RDI;
  CHAR_DATA *victim;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  undefined1 in_stack_ffffffffffffeebf;
  CHAR_DATA *in_stack_ffffffffffffeec0;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  one_argument(in_stack_ffffffffffffede0,(char *)in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
  }
  else {
    arg1 = get_char_room(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    if (arg1 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else {
      bVar1 = is_affected_by((CHAR_DATA *)
                             CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                             (int)((ulong)arg1 >> 0x20));
      if ((bVar1) && (arg1->master == in_RDI)) {
        bVar1 = is_npc(in_stack_ffffffffffffedd8);
        if (bVar1) {
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
              in_stack_ffffffffffffedd8,0);
          extract_char(in_stack_ffffffffffffeec0,(bool)in_stack_ffffffffffffeebf);
        }
        else {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
      }
    }
  }
  return;
}

Assistant:

void do_release(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Release which follower?\n\r", ch);
		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (!is_affected_by(victim, AFF_CHARM) || victim->master != ch)
	{
		send_to_char("They aren't under your control.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		act("$n slowly fades away.", victim, 0, 0, TO_ROOM);
		extract_char(victim, true);
	}
	else
	{
		send_to_char("You can't release a player into the void..maybe nofollow them?\n\r", ch);
		return;
	}
}